

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

void CivetServer::closeHandler(mg_connection *conn)

{
  mg_context *ctx;
  void *pvVar1;
  CivetServer *me;
  mg_connection *conn_local;
  
  me = (CivetServer *)conn;
  ctx = mg_get_context(conn);
  pvVar1 = mg_get_user_data(ctx);
  if (*(long *)((long)pvVar1 + 8) != 0) {
    if (*(long *)((long)pvVar1 + 0x48) != 0) {
      (**(code **)((long)pvVar1 + 0x48))(me);
    }
    mg_lock_context(*(mg_context **)((long)pvVar1 + 8));
    std::
    map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
    ::erase((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
             *)((long)pvVar1 + 0x10),(key_type *)&me);
    mg_unlock_context(*(mg_context **)((long)pvVar1 + 8));
  }
  return;
}

Assistant:

void
CivetServer::closeHandler(const struct mg_connection *conn)
{
	CivetServer *me = (CivetServer *)mg_get_user_data(mg_get_context(conn));
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return;

	if (me->userCloseHandler) {
		me->userCloseHandler(conn);
	}
	mg_lock_context(me->context);
	me->connections.erase(conn);
	mg_unlock_context(me->context);
}